

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixDir_Open(char *zPath,jx9_value *pResource,void **ppHandle)

{
  DIR *pDVar1;
  DIR *pDir;
  void **ppHandle_local;
  jx9_value *pResource_local;
  char *zPath_local;
  
  pDVar1 = opendir(zPath);
  if (pDVar1 == (DIR *)0x0) {
    zPath_local._4_4_ = -1;
  }
  else {
    *ppHandle = pDVar1;
    zPath_local._4_4_ = 0;
  }
  return zPath_local._4_4_;
}

Assistant:

static int UnixDir_Open(const char *zPath, jx9_value *pResource, void **ppHandle)
{
	DIR *pDir;
	/* Open the target directory */
	pDir = opendir(zPath);
	if( pDir == 0 ){
		pResource = 0; /* Compiler warning */
		return -1;
	}
	/* Save our structure */
	*ppHandle = pDir;
	return JX9_OK;
}